

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpnghandler.cpp
# Opt level: O1

Format __thiscall QPngHandlerPrivate::readImageFormat(QPngHandlerPrivate *this)

{
  char cVar1;
  int iVar2;
  Format FVar3;
  int iVar4;
  long in_FS_OFFSET;
  int num_palette;
  png_colorp palette;
  int color_type;
  int bit_depth;
  png_uint_32 height;
  png_uint_32 width;
  int local_34;
  undefined1 *local_30;
  uint local_28;
  int local_24;
  undefined4 local_20;
  undefined4 local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c = 0;
  local_20 = 0;
  local_24 = 0;
  local_28 = 0;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_34 = -0x55555556;
  png_get_IHDR(this->png_ptr,this->info_ptr);
  if (local_28 == 3) {
    iVar2 = png_get_PLTE(this->png_ptr,this->info_ptr,&local_30,&local_34);
    if ((iVar2 != 0) && (local_34 < 0x101)) {
      FVar3 = (uint)(local_24 != 1) * 2 + Format_Mono;
      goto LAB_005b1b6e;
    }
  }
  else if (local_28 == 0) {
    if (local_24 == 1) {
      cVar1 = png_get_channels(this->png_ptr,this->info_ptr);
      FVar3 = Format_Mono;
      if (cVar1 == '\x01') goto LAB_005b1b6e;
    }
    if (local_24 == 8) {
      iVar2 = png_get_valid(this->png_ptr,this->info_ptr,0x10);
      if (iVar2 == 0) {
        FVar3 = Format_Grayscale8;
        goto LAB_005b1b6e;
      }
    }
    else if (local_24 == 0x10) {
      iVar2 = png_get_valid(this->png_ptr,this->info_ptr,0x10);
      FVar3 = (uint)(iVar2 == 0) * 2 + Format_RGBA64;
      goto LAB_005b1b6e;
    }
    FVar3 = Format_Indexed8;
    goto LAB_005b1b6e;
  }
  if (local_24 == 0x10) {
    if ((local_28 & 1) != 0) goto LAB_005b1b28;
    FVar3 = Format_RGBA64;
    if ((local_28 & 4) != 0) goto LAB_005b1b6e;
    iVar2 = png_get_valid(this->png_ptr,this->info_ptr,0x10);
    iVar4 = 0x1a;
  }
  else {
LAB_005b1b28:
    FVar3 = Format_ARGB32;
    if ((local_28 & 4) != 0) goto LAB_005b1b6e;
    iVar2 = png_get_valid(this->png_ptr,this->info_ptr,0x10);
    iVar4 = 5;
  }
  FVar3 = iVar4 - (uint)(iVar2 == 0);
LAB_005b1b6e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return FVar3;
  }
  __stack_chk_fail();
}

Assistant:

QImage::Format QPngHandlerPrivate::readImageFormat()
{
        QImage::Format format = QImage::Format_Invalid;
        png_uint_32 width = 0, height = 0;
        int bit_depth = 0, color_type = 0;
        png_colorp palette;
        int num_palette;
        png_get_IHDR(png_ptr, info_ptr, &width, &height, &bit_depth, &color_type, nullptr, nullptr, nullptr);
        if (color_type == PNG_COLOR_TYPE_GRAY) {
            // Black & White or grayscale
            if (bit_depth == 1 && png_get_channels(png_ptr, info_ptr) == 1) {
                format = QImage::Format_Mono;
            } else if (bit_depth == 16) {
                format = png_get_valid(png_ptr, info_ptr, PNG_INFO_tRNS) ? QImage::Format_RGBA64 : QImage::Format_Grayscale16;
            } else if (bit_depth == 8 && !png_get_valid(png_ptr, info_ptr, PNG_INFO_tRNS)) {
                format = QImage::Format_Grayscale8;
            } else {
                format = QImage::Format_Indexed8;
            }
        } else if (color_type == PNG_COLOR_TYPE_PALETTE
                   && png_get_PLTE(png_ptr, info_ptr, &palette, &num_palette)
                   && num_palette <= 256)
        {
            // 1-bit and 8-bit color
            format = bit_depth == 1 ? QImage::Format_Mono : QImage::Format_Indexed8;
        } else if (bit_depth == 16 && !(color_type & PNG_COLOR_MASK_PALETTE)) {
            format = QImage::Format_RGBA64;
            if (!(color_type & PNG_COLOR_MASK_ALPHA) && !png_get_valid(png_ptr, info_ptr, PNG_INFO_tRNS))
                format = QImage::Format_RGBX64;
        } else {
            // 32-bit
            format = QImage::Format_ARGB32;
            // Only add filler if no alpha, or we can get 5 channel data.
            if (!(color_type & PNG_COLOR_MASK_ALPHA)
                && !png_get_valid(png_ptr, info_ptr, PNG_INFO_tRNS)) {
                // We want 4 bytes, but it isn't an alpha channel
                format = QImage::Format_RGB32;
            }
        }

        return format;
}